

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::PostprocFiltersTest_MD5Match_Test::~PostprocFiltersTest_MD5Match_Test
          (PostprocFiltersTest_MD5Match_Test *this)

{
  anon_unknown.dwarf_13075bd::PostprocFiltersTest_MD5Match_Test::~PostprocFiltersTest_MD5Match_Test
            ((PostprocFiltersTest_MD5Match_Test *)(this + -0x18));
  return;
}

Assistant:

TEST_P(PostprocFiltersTest, MD5Match) { DoTest(); }